

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImDrawList *pIVar1;
  float *pfVar2;
  ImGuiNavMoveResult *pIVar3;
  int *piVar4;
  ImGuiNextWindowData *pIVar5;
  ImVec2 *pIVar6;
  ImVec2 *pIVar7;
  ImFontAtlas *pIVar8;
  ImGuiWindow **ppIVar9;
  ImGuiPopupData *pIVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  ImGuiID IVar14;
  bool bVar15;
  int i;
  uint uVar16;
  ImGuiID IVar17;
  ImGuiInputSource IVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ImGuiWindow *pIVar22;
  ImGuiWindow **__dest;
  ImGuiPopupData *__dest_00;
  int i_1;
  ImGuiID IVar23;
  ImGuiWindow *window_00;
  char *pcVar24;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar25;
  long lVar26;
  ImGuiDir IVar27;
  ImGuiWindow *window;
  int i_2;
  ImGuiNavMoveResult *pIVar28;
  ImGuiID IVar29;
  float *pfVar30;
  long lVar31;
  ImGuiNavLayer IVar32;
  ImGuiID IVar33;
  ImFont *font;
  float *pfVar34;
  byte bVar35;
  ImGuiContext *g_5;
  ImGuiContext *g_1;
  ImRect *pIVar36;
  ImGuiWindow *old_nav_window;
  bool *pbVar37;
  ulong uVar38;
  ImGuiContext *pIVar39;
  ImGuiContext *g;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  byte bVar43;
  uint uVar44;
  float fVar45;
  ImVec2 IVar46;
  float fVar54;
  ImVec2 IVar47;
  ImVec2 IVar48;
  ImVec2 IVar49;
  ImVec2 IVar50;
  ImVec2 IVar52;
  double dVar51;
  undefined1 auVar53 [16];
  float fVar55;
  float fVar56;
  ImVec2 IVar57;
  ImVec2 IVar58;
  float fVar61;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ImRect local_40;
  
  pIVar11 = GImGui;
  bVar43 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdfc,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde4,"void NewFrameSanityChecks()");
  }
  fVar64 = (GImGui->IO).DeltaTime;
  iVar20 = GImGui->FrameCount;
  if (fVar64 <= 0.0) {
    if (iVar20 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0xde5,"void NewFrameSanityChecks()");
    }
  }
  else if ((iVar20 != 0) && (GImGui->FrameCountEnded != iVar20)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde6,"void NewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde7,"void NewFrameSanityChecks()");
  }
  pIVar8 = (GImGui->IO).Fonts;
  if ((pIVar8->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde8,"void NewFrameSanityChecks()");
  }
  if ((*(pIVar8->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde9,"void NewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdea,"void NewFrameSanityChecks()");
  }
  fVar55 = (GImGui->Style).Alpha;
  if ((fVar55 < 0.0) || (1.0 < fVar55)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdeb,"void NewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdec,"void NewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xded,"void NewFrameSanityChecks()");
  }
  lVar21 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar21] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0xdef,"void NewFrameSanityChecks()");
    }
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdf3,"void NewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar11->SettingsLoaded == false) {
    if ((pIVar11->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0xe09,"void ImGui::NewFrame()");
    }
    pcVar24 = (pIVar11->IO).IniFilename;
    if (pcVar24 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar24);
      fVar64 = (pIVar11->IO).DeltaTime;
    }
    pIVar11->SettingsLoaded = true;
  }
  if ((0.0 < pIVar11->SettingsDirtyTimer) &&
     (fVar55 = pIVar11->SettingsDirtyTimer - fVar64, pIVar11->SettingsDirtyTimer = fVar55,
     fVar55 <= 0.0)) {
    pcVar24 = (pIVar11->IO).IniFilename;
    if (pcVar24 == (char *)0x0) {
      (pIVar11->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar24);
      fVar64 = (pIVar11->IO).DeltaTime;
    }
    pIVar11->SettingsDirtyTimer = 0.0;
  }
  pIVar11->Time = (double)fVar64 + pIVar11->Time;
  pIVar11->WithinFrameScope = true;
  pIVar11->FrameCount = pIVar11->FrameCount + 1;
  pIVar11->TooltipOverrideCount = 0;
  pIVar11->WindowsActiveCount = 0;
  ((pIVar11->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar8 = (GImGui->IO).Fonts;
    if ((pIVar8->Fonts).Size < 1) {
      pcVar24 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_001da015:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                    ,0x503,pcVar24);
    }
    font = *(pIVar8->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar11->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xe26,"void ImGui::NewFrame()");
  }
  fVar64 = (pIVar11->IO).DisplaySize.x;
  fVar55 = (pIVar11->IO).DisplaySize.y;
  (pIVar11->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar11->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar11->DrawListSharedData).ClipRectFullscreen.z = fVar64;
  (pIVar11->DrawListSharedData).ClipRectFullscreen.w = fVar55;
  (pIVar11->DrawListSharedData).CurveTessellationTol = (pIVar11->Style).CurveTessellationTol;
  bVar40 = (pIVar11->Style).AntiAliasedLines;
  uVar16 = (uint)bVar40;
  (pIVar11->DrawListSharedData).InitialFlags = (uint)bVar40;
  if ((pIVar11->Style).AntiAliasedFill == true) {
    uVar16 = bVar40 | 2;
    (pIVar11->DrawListSharedData).InitialFlags = uVar16;
  }
  if (((pIVar11->IO).BackendFlags & 8) != 0) {
    (pIVar11->DrawListSharedData).InitialFlags = uVar16 | 4;
  }
  pIVar1 = &pIVar11->BackgroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar11->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  pIVar1 = &pIVar11->ForegroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar11->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar11->DrawData).Valid = false;
  (pIVar11->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar11->DrawData).CmdListsCount = 0;
  (pIVar11->DrawData).TotalIdxCount = 0;
  (pIVar11->DrawData).TotalVtxCount = 0;
  (pIVar11->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar11->DrawData).DisplayPos.y = 0;
  (pIVar11->DrawData).DisplaySize.x = 0.0;
  (pIVar11->DrawData).DisplaySize.y = 0.0;
  (pIVar11->DrawData).FramebufferScale.x = 0.0;
  pIVar39 = GImGui;
  (pIVar11->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar11->DragDropActive == true) &&
     (IVar23 = (pIVar11->DragDropPayload).SourceId, IVar23 == pIVar11->ActiveId)) {
    if (GImGui->ActiveId == IVar23) {
      GImGui->ActiveIdIsAlive = IVar23;
    }
    if (pIVar39->ActiveIdPreviousFrame == IVar23) {
      pIVar39->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar11->HoveredIdPreviousFrame == 0) {
    IVar23 = pIVar11->HoveredId;
    pIVar11->HoveredIdTimer = 0.0;
    pIVar11->HoveredIdNotActiveTimer = 0.0;
    if (IVar23 == 0) goto LAB_001d77eb;
LAB_001d77c0:
    fVar64 = (pIVar11->IO).DeltaTime;
    pIVar11->HoveredIdTimer = pIVar11->HoveredIdTimer + fVar64;
    IVar17 = IVar23;
    if (pIVar11->ActiveId != IVar23) {
      pIVar11->HoveredIdNotActiveTimer = fVar64 + pIVar11->HoveredIdNotActiveTimer;
      IVar17 = pIVar11->ActiveId;
    }
  }
  else {
    IVar23 = pIVar11->HoveredId;
    if (IVar23 != 0) {
      if (pIVar11->ActiveId == IVar23) {
        pIVar11->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_001d77c0;
    }
LAB_001d77eb:
    IVar23 = 0;
    IVar17 = pIVar11->ActiveId;
  }
  pIVar11->HoveredIdPreviousFrame = IVar23;
  pIVar11->HoveredId = 0;
  pIVar11->HoveredIdAllowOverlap = false;
  if (((pIVar11->ActiveIdIsAlive != IVar17) && (IVar17 != 0)) &&
     (pIVar11->ActiveIdPreviousFrame == IVar17)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    IVar17 = pIVar11->ActiveId;
  }
  fVar64 = (pIVar11->IO).DeltaTime;
  if (IVar17 != 0) {
    pIVar11->ActiveIdTimer = pIVar11->ActiveIdTimer + fVar64;
  }
  pIVar11->LastActiveIdTimer = pIVar11->LastActiveIdTimer + fVar64;
  pIVar11->ActiveIdPreviousFrame = IVar17;
  pIVar11->ActiveIdPreviousFrameWindow = pIVar11->ActiveIdWindow;
  pIVar11->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar11->ActiveIdHasBeenEditedBefore;
  pIVar11->ActiveIdIsAlive = 0;
  pIVar11->ActiveIdHasBeenEditedThisFrame = false;
  pIVar11->ActiveIdPreviousFrameIsAlive = false;
  pIVar11->ActiveIdIsJustActivated = false;
  if (pIVar11->TempInputTextId == 0) {
LAB_001d78dd:
    if (IVar17 == 0) {
      pIVar11->ActiveIdUsingNavDirMask = 0;
      pIVar11->ActiveIdUsingNavInputMask = 0;
      pIVar11->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar17 != pIVar11->TempInputTextId) {
    pIVar11->TempInputTextId = 0;
    goto LAB_001d78dd;
  }
  pIVar11->DragDropAcceptIdPrev = pIVar11->DragDropAcceptIdCurr;
  pIVar11->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar11->DragDropAcceptIdCurr = 0;
  pIVar11->DragDropWithinSourceOrTarget = false;
  pfVar2 = (pIVar11->IO).KeysDownDuration;
  memcpy((pIVar11->IO).KeysDownDurationPrev,pfVar2,0x800);
  lVar21 = 0;
  do {
    fVar55 = -1.0;
    if ((pIVar11->IO).KeysDown[lVar21] == true) {
      fVar55 = 0.0;
      if (0.0 <= pfVar2[lVar21]) {
        fVar55 = pfVar2[lVar21] + fVar64;
      }
    }
    pfVar2[lVar21] = fVar55;
    pIVar39 = GImGui;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x200);
  (GImGui->IO).WantSetMousePos = false;
  uVar16 = (pIVar39->IO).ConfigFlags;
  if (((uVar16 & 2) == 0) || (((pIVar39->IO).BackendFlags & 1) == 0)) {
    bVar35 = 0;
  }
  else if (((0.0 < (pIVar39->IO).NavInputs[0]) || (0.0 < (pIVar39->IO).NavInputs[2])) ||
          ((0.0 < (pIVar39->IO).NavInputs[1] || (bVar35 = 1, 0.0 < (pIVar39->IO).NavInputs[3])))) {
    pIVar39->NavInputSource = ImGuiInputSource_NavGamepad;
    bVar35 = 1;
  }
  if ((uVar16 & 1) != 0) {
    uVar44 = (pIVar39->IO).KeyMap[0xc];
    if (-1 < (long)(int)uVar44) {
      if (0x1ff < uVar44) goto LAB_001da01f;
      if ((pIVar39->IO).KeysDown[(int)uVar44] == true) {
        (pIVar39->IO).NavInputs[0] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar44 = (pIVar39->IO).KeyMap[0xd];
    if (-1 < (long)(int)uVar44) {
      if (0x1ff < uVar44) goto LAB_001da01f;
      if ((pIVar39->IO).KeysDown[(int)uVar44] == true) {
        (pIVar39->IO).NavInputs[2] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar44 = (pIVar39->IO).KeyMap[0xe];
    if (-1 < (long)(int)uVar44) {
      if (0x1ff < uVar44) goto LAB_001da01f;
      if ((pIVar39->IO).KeysDown[(int)uVar44] == true) {
        (pIVar39->IO).NavInputs[1] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar44 = (pIVar39->IO).KeyMap[1];
    if (-1 < (long)(int)uVar44) {
      if (0x1ff < uVar44) goto LAB_001da01f;
      if ((pIVar39->IO).KeysDown[(int)uVar44] == true) {
        (pIVar39->IO).NavInputs[0x11] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar44 = (pIVar39->IO).KeyMap[2];
    if (-1 < (long)(int)uVar44) {
      if (0x1ff < uVar44) goto LAB_001da01f;
      if ((pIVar39->IO).KeysDown[(int)uVar44] == true) {
        (pIVar39->IO).NavInputs[0x12] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar44 = (pIVar39->IO).KeyMap[3];
    if (-1 < (long)(int)uVar44) {
      if (0x1ff < uVar44) goto LAB_001da01f;
      if ((pIVar39->IO).KeysDown[(int)uVar44] == true) {
        (pIVar39->IO).NavInputs[0x13] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    uVar44 = (pIVar39->IO).KeyMap[4];
    if (-1 < (long)(int)uVar44) {
      if (0x1ff < uVar44) {
LAB_001da01f:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0x10c7,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar39->IO).KeysDown[(int)uVar44] == true) {
        (pIVar39->IO).NavInputs[0x14] = 1.0;
        pIVar39->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar40 = (pIVar39->IO).KeyCtrl;
    if (bVar40 == true) {
      (pIVar39->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar39->IO).KeyShift == true) {
      (pIVar39->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar40 == false) && ((pIVar39->IO).KeyAlt != false)) {
      (pIVar39->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar2 = (pIVar39->IO).NavInputsDownDuration;
  pfVar30 = pfVar2;
  pfVar34 = (pIVar39->IO).NavInputsDownDurationPrev;
  for (lVar21 = 0x15; lVar21 != 0; lVar21 = lVar21 + -1) {
    *pfVar34 = *pfVar30;
    pfVar30 = pfVar30 + (ulong)bVar43 * -2 + 1;
    pfVar34 = pfVar34 + (ulong)bVar43 * -2 + 1;
  }
  lVar21 = 0;
  do {
    fVar64 = -1.0;
    if (0.0 < (pIVar39->IO).NavInputs[lVar21]) {
      fVar64 = 0.0;
      if (0.0 <= pfVar2[lVar21]) {
        fVar64 = pfVar2[lVar21] + (pIVar39->IO).DeltaTime;
      }
    }
    pfVar2[lVar21] = fVar64;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x15);
  IVar23 = pIVar39->NavInitResultId;
  if ((IVar23 != 0) &&
     (((pIVar39->NavDisableHighlight != true || (pIVar39->NavInitRequestFromMove == true)) &&
      (pIVar39->NavWindow != (ImGuiWindow *)0x0)))) {
    IVar32 = pIVar39->NavLayer;
    if (pIVar39->NavInitRequestFromMove == true) {
      SetNavID(IVar23,IVar32,0);
      IVar46 = (pIVar39->NavInitResultRectRel).Max;
      pIVar6 = &pIVar39->NavWindow->NavRectRel[(int)IVar32].Min;
      *pIVar6 = (pIVar39->NavInitResultRectRel).Min;
      pIVar6[1] = IVar46;
      pIVar39->NavMousePosDirty = true;
      pIVar39->NavDisableHighlight = false;
      pIVar39->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar23,IVar32,0);
    }
    IVar46 = (pIVar39->NavInitResultRectRel).Max;
    pIVar6 = &pIVar39->NavWindow->NavRectRel[pIVar39->NavLayer].Min;
    *pIVar6 = (pIVar39->NavInitResultRectRel).Min;
    pIVar6[1] = IVar46;
  }
  pIVar39->NavInitRequest = false;
  pIVar39->NavInitRequestFromMove = false;
  pIVar39->NavInitResultId = 0;
  pIVar39->NavJustMovedToId = 0;
  pIVar12 = GImGui;
  if (pIVar39->NavMoveRequest == true) {
    IVar23 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar23 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar12->NavDisableHighlight = false;
        pIVar12->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar3 = &GImGui->NavMoveResultOther;
      pIVar28 = &GImGui->NavMoveResultLocal;
      if (IVar23 == 0) {
        pIVar28 = pIVar3;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar23 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar23 != 0)) &&
         (IVar23 != GImGui->NavId)) {
        pIVar28 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar28 == pIVar3) {
LAB_001d7d7e:
        pIVar28 = pIVar3;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar64 = (GImGui->NavMoveResultOther).DistBox;
        fVar55 = pIVar28->DistBox;
        if (fVar55 <= fVar64) {
          if (((fVar64 != fVar55) || (NAN(fVar64) || NAN(fVar55))) ||
             (pfVar2 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar28->DistCenter < *pfVar2 || pIVar28->DistCenter == *pfVar2)) goto LAB_001d7d81;
        }
        goto LAB_001d7d7e;
      }
LAB_001d7d81:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar22 = pIVar28->Window, pIVar22 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0x218c,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar46 = (pIVar28->RectRel).Min;
          IVar48 = (pIVar28->RectRel).Max;
          fVar64 = (pIVar22->Pos).x;
          local_40.Min.x = IVar46.x + fVar64;
          fVar55 = (pIVar22->Pos).y;
          local_40.Min.y = IVar46.y + fVar55;
          local_40.Max.x = IVar48.x + fVar64;
          local_40.Max.y = IVar48.y + fVar55;
          IVar46 = ScrollToBringRectIntoView(pIVar28->Window,&local_40);
        }
        else {
          fVar64 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar64 = (pIVar22->ScrollMax).y;
          }
          IVar46 = (ImVec2)((ulong)(uint)((pIVar22->Scroll).y - fVar64) << 0x20);
          (pIVar22->ScrollTarget).y = fVar64;
          (pIVar22->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar64 = (pIVar28->RectRel).Min.y;
        fVar55 = (pIVar28->RectRel).Max.x;
        fVar45 = (pIVar28->RectRel).Max.y;
        (pIVar28->RectRel).Min.x = (pIVar28->RectRel).Min.x - IVar46.x;
        (pIVar28->RectRel).Min.y = fVar64 - IVar46.y;
        (pIVar28->RectRel).Max.x = fVar55 - IVar46.x;
        (pIVar28->RectRel).Max.y = fVar45 - IVar46.y;
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar12->NavWindow = pIVar28->Window;
      IVar23 = pIVar28->ID;
      if (pIVar12->NavId == IVar23) {
        IVar17 = pIVar28->FocusScopeId;
      }
      else {
        pIVar12->NavJustMovedToId = IVar23;
        IVar17 = pIVar28->FocusScopeId;
        pIVar12->NavJustMovedToFocusScopeId = IVar17;
      }
      pIVar13 = GImGui;
      IVar32 = pIVar12->NavLayer;
      SetNavID(IVar23,IVar32,IVar17);
      IVar46 = (pIVar28->RectRel).Max;
      pIVar6 = &pIVar13->NavWindow->NavRectRel[(int)IVar32].Min;
      *pIVar6 = (pIVar28->RectRel).Min;
      pIVar6[1] = IVar46;
      pIVar13->NavMousePosDirty = true;
      pIVar13->NavDisableHighlight = false;
      pIVar13->NavDisableMouseHover = true;
      pIVar12->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar39->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar39->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2097,"void ImGui::NavUpdate()");
    }
    if (((pIVar39->NavMoveResultLocal).ID == 0) && ((pIVar39->NavMoveResultOther).ID == 0)) {
      pIVar39->NavDisableHighlight = false;
    }
    pIVar39->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar39->NavMousePosDirty == true) && (pIVar39->NavIdIsAlive == true)) {
    if ((((pIVar39->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar39->IO).BackendFlags & 4) != 0 && (pIVar39->NavDisableHighlight == false)) &&
         (pIVar39->NavDisableMouseHover == true)) && (pIVar39->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar46 = NavCalcPreferredRefPos();
      (pIVar39->IO).MousePosPrev = IVar46;
      (pIVar39->IO).MousePos = IVar46;
      (pIVar39->IO).WantSetMousePos = true;
    }
    pIVar39->NavMousePosDirty = false;
  }
  pIVar39->NavIdIsAlive = false;
  pIVar39->NavJustTabbedId = 0;
  IVar32 = pIVar39->NavLayer;
  if (ImGuiNavLayer_Menu < IVar32) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x20ad,"void ImGui::NavUpdate()");
  }
  pIVar22 = pIVar39->NavWindow;
  pIVar25 = pIVar22;
  if (pIVar22 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar25->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar25 != pIVar22) {
          pIVar25->NavLastChildNavWindow = pIVar22;
        }
        break;
      }
      ppIVar9 = &pIVar25->ParentWindow;
      pIVar25 = *ppIVar9;
    } while (*ppIVar9 != (ImGuiWindow *)0x0);
    if ((IVar32 == ImGuiNavLayer_Main) && (pIVar22->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar22->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar12 = GImGui;
  pIVar22 = GetTopMostPopupModal();
  if (pIVar22 == (ImGuiWindow *)0x0) {
    if (pIVar12->NavWindowingTargetAnim == (ImGuiWindow *)0x0) {
      if (pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_001d803d;
LAB_001d805a:
      fVar64 = (pIVar12->IO).NavInputsDownDuration[3];
      if ((((pIVar12->IO).KeyCtrl == true) && (iVar20 = (pIVar12->IO).KeyMap[0], -1 < iVar20)) &&
         (bVar40 = IsKeyPressed(iVar20,true), bVar40)) {
        bVar43 = (byte)(pIVar12->IO).ConfigFlags;
        uVar44 = (uint)bVar43;
        if (fVar64 == 0.0 || (bVar43 & 1) != 0) {
LAB_001d80b4:
          pIVar22 = pIVar12->NavWindow;
          if ((pIVar22 != (ImGuiWindow *)0x0) ||
             (pIVar22 = FindWindowNavFocusable
                                  ((pIVar12->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
             pIVar22 != (ImGuiWindow *)0x0)) {
            pIVar12->NavWindowingTargetAnim = pIVar22;
            pIVar12->NavWindowingTarget = pIVar22;
            pIVar12->NavWindowingTimer = 0.0;
            pIVar12->NavWindowingHighlightAlpha = 0.0;
            pIVar12->NavWindowingToggleLayer = (bool)(~(byte)uVar44 & 1);
            pIVar12->NavInputSource = ImGuiInputSource_NavGamepad - (uVar44 & 1);
          }
        }
      }
      else if ((fVar64 == 0.0) && (!NAN(fVar64))) {
        uVar44 = 0;
        goto LAB_001d80b4;
      }
      fVar64 = (pIVar12->IO).DeltaTime + pIVar12->NavWindowingTimer;
      pIVar12->NavWindowingTimer = fVar64;
      if (pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_001d813c;
LAB_001d82dc:
      bVar40 = false;
      pIVar22 = (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0) {
        fVar64 = (pIVar12->IO).DeltaTime * -10.0 + pIVar12->NavWindowingHighlightAlpha;
        fVar64 = (float)(-(uint)(0.0 <= fVar64) & (uint)fVar64);
        pIVar12->NavWindowingHighlightAlpha = fVar64;
        if ((pIVar12->DimBgRatio <= 0.0) && (fVar64 <= 0.0)) {
          pIVar12->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
        goto LAB_001d805a;
      }
LAB_001d803d:
      fVar64 = (pIVar12->IO).DeltaTime + pIVar12->NavWindowingTimer;
      pIVar12->NavWindowingTimer = fVar64;
LAB_001d813c:
      IVar18 = pIVar12->NavInputSource;
      if (IVar18 != ImGuiInputSource_NavGamepad) {
LAB_001d8245:
        if (IVar18 == ImGuiInputSource_NavKeyboard) {
          fVar55 = (pIVar12->NavWindowingTimer + -0.2) / 0.05;
          fVar64 = 1.0;
          if (fVar55 <= 1.0) {
            fVar64 = fVar55;
          }
          fVar64 = (float)(~-(uint)(fVar55 < 0.0) & (uint)fVar64);
          uVar44 = -(uint)(fVar64 <= pIVar12->NavWindowingHighlightAlpha);
          pIVar12->NavWindowingHighlightAlpha =
               (float)(uVar44 & (uint)pIVar12->NavWindowingHighlightAlpha | ~uVar44 & (uint)fVar64);
          iVar20 = (GImGui->IO).KeyMap[0];
          if ((-1 < iVar20) && (bVar40 = IsKeyPressed(iVar20,true), bVar40)) {
            NavUpdateWindowingHighlightWindow((pIVar12->IO).KeyShift - 1 | 1);
          }
          if ((pIVar12->IO).KeyCtrl == false) {
            pIVar22 = pIVar12->NavWindowingTarget;
            bVar40 = false;
            goto LAB_001d832b;
          }
        }
        goto LAB_001d82dc;
      }
      fVar55 = (fVar64 + -0.2) / 0.05;
      fVar64 = 1.0;
      if (fVar55 <= 1.0) {
        fVar64 = fVar55;
      }
      fVar64 = (float)(~-(uint)(fVar55 < 0.0) & (uint)fVar64);
      uVar44 = -(uint)(fVar64 <= pIVar12->NavWindowingHighlightAlpha);
      fVar45 = (float)(uVar44 & (uint)pIVar12->NavWindowingHighlightAlpha | ~uVar44 & (uint)fVar64);
      pIVar12->NavWindowingHighlightAlpha = fVar45;
      fVar64 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar55 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar20 = (uint)(0.0 < fVar64) - (uint)(0.0 < fVar55);
      if (iVar20 != 0) {
        NavUpdateWindowingHighlightWindow(iVar20);
        pIVar12->NavWindowingHighlightAlpha = 1.0;
        fVar45 = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) {
        if (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_001d82dc;
        IVar18 = pIVar12->NavInputSource;
        goto LAB_001d8245;
      }
      pbVar37 = &pIVar12->NavWindowingToggleLayer;
      *pbVar37 = (bool)(*pbVar37 & fVar45 < 1.0);
      if (*pbVar37 == false) {
        pIVar22 = pIVar12->NavWindowingTarget;
        bVar40 = false;
      }
      else {
        bVar40 = pIVar12->NavWindow != (ImGuiWindow *)0x0;
        pIVar22 = (ImGuiWindow *)0x0;
      }
      pIVar12->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
LAB_001d832b:
    pIVar13 = GImGui;
    fVar64 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar64 == 0.0) && (!NAN(fVar64))) {
      pIVar12->NavWindowingToggleLayer = true;
    }
    if ((((pIVar12->ActiveId == 0) || (pIVar12->ActiveIdAllowOverlap == true)) && (fVar64 < 0.0)) &&
       ((pIVar12->NavWindowingToggleLayer != false &&
        (0.0 <= (pIVar13->IO).NavInputsDownDurationPrev[0x10])))) {
      bVar41 = IsMousePosValid(&(pIVar12->IO).MousePos);
      bVar42 = IsMousePosValid(&(pIVar12->IO).MousePosPrev);
      bVar40 = (bool)(bVar42 == bVar41 | bVar40);
    }
    pIVar25 = pIVar12->NavWindowingTarget;
    if ((pIVar25 != (ImGuiWindow *)0x0) && ((pIVar25->Flags & 4) == 0)) {
      IVar18 = pIVar12->NavInputSource;
      if ((IVar18 == ImGuiInputSource_NavGamepad) ||
         ((IVar46.x = 0.0, IVar46.y = 0.0, IVar18 == ImGuiInputSource_NavKeyboard &&
          (IVar18 = ImGuiInputSource_Mouse, (pIVar12->IO).KeyShift == false)))) {
        IVar46 = GetNavInputAmount2d(IVar18,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar64 = IVar46.y;
      if (((IVar46.x != 0.0) || (fVar64 != 0.0)) || (NAN(fVar64))) {
        fVar55 = (pIVar12->IO).DisplayFramebufferScale.x;
        fVar45 = (pIVar12->IO).DisplayFramebufferScale.y;
        if (fVar45 <= fVar55) {
          fVar55 = fVar45;
        }
        fVar55 = (float)(int)(fVar55 * (pIVar12->IO).DeltaTime * 800.0);
        IVar48 = pIVar25->RootWindow->Pos;
        local_40.Min.x = IVar48.x + IVar46.x * fVar55;
        local_40.Min.y = IVar48.y + fVar64 * fVar55;
        SetWindowPos(pIVar25->RootWindow,&local_40.Min,1);
        pIVar12->NavDisableMouseHover = true;
        if (((pIVar12->NavWindowingTarget->Flags & 0x100) == 0) &&
           (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    if (pIVar22 != (ImGuiWindow *)0x0) {
      if ((pIVar12->NavWindow == (ImGuiWindow *)0x0) || (pIVar22 != pIVar12->NavWindow->RootWindow))
      {
        SetActiveID(0,(ImGuiWindow *)0x0);
        pIVar12->NavDisableHighlight = false;
        pIVar12->NavDisableMouseHover = true;
        pIVar25 = pIVar22->NavLastChildNavWindow;
        if (pIVar22->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar25 = pIVar22;
        }
        ClosePopupsOverWindow(pIVar25,false);
        FocusWindow(pIVar25);
        if (pIVar25->NavLastIds[0] == 0) {
          NavInitWindow(pIVar25,false);
        }
        if ((pIVar25->DC).NavLayerActiveMask == 2) {
          pIVar12->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar12->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar40) && (pIVar22 = pIVar12->NavWindow, pIVar25 = pIVar22, pIVar22 != (ImGuiWindow *)0x0)
       ) {
      while (window_00 = pIVar25, window_00->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window_00->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar25 = window_00->ParentWindow, (window_00->Flags & 0x15000000U) != 0x1000000))
        break;
      }
      if (window_00 != pIVar22) {
        FocusWindow(window_00);
        window_00->NavLastChildNavWindow = pIVar22;
        pIVar22 = pIVar12->NavWindow;
      }
      pIVar12->NavDisableHighlight = false;
      pIVar12->NavDisableMouseHover = true;
      IVar32 = ImGuiNavLayer_Main;
      if (((pIVar22->DC).NavLayerActiveMask & 2) != 0) {
        IVar32 = pIVar12->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar32);
    }
  }
  else {
    pIVar12->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bool)((uVar16 & 1) == 0 & (bVar35 ^ 1))) || (pIVar39->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar39->IO).NavActive = false;
LAB_001d85dc:
    bVar40 = pIVar39->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar40 = (pIVar39->NavWindow->Flags & 0x40000U) == 0;
    (pIVar39->IO).NavActive = bVar40;
    if (((!bVar40) || (pIVar39->NavId == 0)) ||
       (bVar40 = true, pIVar39->NavDisableHighlight != false)) goto LAB_001d85dc;
  }
  (pIVar39->IO).NavVisible = bVar40;
  fVar64 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar64 == 0.0) && (!NAN(fVar64))) {
    if (pIVar39->ActiveId == 0) {
      pIVar22 = pIVar39->NavWindow;
      if (((pIVar22 == (ImGuiWindow *)0x0) || ((pIVar22->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar22->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar20 = (pIVar39->OpenPopupStack).Size;
        if ((long)iVar20 < 1) {
          if (pIVar39->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x5000000U) != 0x1000000)) {
              pIVar22->NavLastIds[0] = 0;
            }
            pIVar39->NavId = 0;
            pIVar39->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar39->OpenPopupStack).Data[(long)iVar20 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar20 + -1,true);
        }
      }
      else {
        if (pIVar22->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                        ,0x20c9,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar22->ParentWindow);
        pIVar12 = GImGui;
        pIVar25 = GImGui->NavWindow;
        if (pIVar25 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                        ,0x1e8e,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
        }
        IVar23 = pIVar22->ChildId;
        GImGui->NavId = IVar23;
        pIVar12->NavFocusScopeId = 0;
        pIVar25->NavLastIds[0] = IVar23;
        pIVar39->NavIdIsAlive = false;
        if (pIVar39->NavDisableMouseHover == true) {
          pIVar39->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar39->NavActivateId = 0;
  pIVar39->NavActivateDownId = 0;
  pIVar39->NavActivatePressedId = 0;
  pIVar12 = GImGui;
  pIVar39->NavInputId = 0;
  IVar23 = pIVar39->NavId;
  IVar17 = 0;
  if ((IVar23 == 0) || (pIVar39->NavDisableHighlight != false)) {
    IVar29 = 0;
LAB_001d875f:
    pIVar22 = pIVar39->NavWindow;
    bVar40 = pIVar22 == (ImGuiWindow *)0x0;
    if ((!bVar40) && ((pIVar22->Flags & 0x40000) != 0)) {
      pIVar39->NavDisableHighlight = true;
    }
    if (IVar17 != IVar29 && IVar29 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x20f7,"void ImGui::NavUpdate()");
    }
  }
  else {
    IVar29 = 0;
    if (pIVar39->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_001d875f;
    IVar17 = 0;
    if (pIVar39->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar39->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          fVar64 = (GImGui->IO).NavInputsDownDuration[0];
          IVar14 = IVar23;
          if (0.0 <= fVar64) {
            IVar33 = pIVar39->ActiveId;
            if (IVar33 == 0 && fVar64 == 0.0) {
              pIVar39->NavActivateId = IVar23;
              pIVar39->NavActivateDownId = IVar23;
              IVar29 = IVar23;
            }
            else {
              if (IVar33 == 0) {
                pIVar39->NavActivateDownId = IVar23;
              }
              else {
                if (IVar33 != IVar23) goto LAB_001d89ac;
                pIVar39->NavActivateDownId = IVar23;
              }
              IVar29 = 0;
              if ((fVar64 != 0.0) || (IVar29 = 0, NAN(fVar64))) goto LAB_001d9cfb;
            }
            pIVar39->NavActivatePressedId = IVar23;
          }
          else {
            IVar33 = pIVar39->ActiveId;
            if ((IVar33 != 0) && (IVar33 != IVar23)) goto LAB_001d89ac;
            pIVar39->NavActivateDownId = IVar23;
            IVar29 = 0;
          }
        }
        else {
          IVar33 = pIVar39->ActiveId;
          if (IVar33 == 0) {
            IVar29 = 0;
            IVar14 = 0;
          }
          else {
LAB_001d89ac:
            IVar17 = 0;
            IVar29 = 0;
            IVar14 = 0;
            if (IVar33 != IVar23) goto LAB_001d875f;
          }
        }
LAB_001d9cfb:
        IVar17 = IVar14;
        fVar64 = (pIVar12->IO).NavInputsDownDuration[2];
        if ((fVar64 == 0.0) && (!NAN(fVar64))) {
          pIVar39->NavInputId = IVar23;
        }
      }
      goto LAB_001d875f;
    }
    bVar40 = true;
    pIVar22 = (ImGuiWindow *)0x0;
  }
  pIVar39->NavMoveRequest = false;
  IVar23 = pIVar39->NavNextActivateId;
  if (IVar23 != 0) {
    pIVar39->NavActivateId = IVar23;
    pIVar39->NavActivateDownId = IVar23;
    pIVar39->NavActivatePressedId = IVar23;
    pIVar39->NavInputId = IVar23;
  }
  pIVar39->NavNextActivateId = 0;
  if (pIVar39->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar39->NavMoveDir = -1;
    pIVar39->NavMoveRequestFlags = 0;
    IVar27 = -1;
    if (((!bVar40) && (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar22->Flags & 0x40000) == 0)) {
      uVar44 = GImGui->ActiveIdUsingNavDirMask;
      IVar27 = -1;
      if (((uVar44 & 1) == 0) &&
         ((fVar64 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar64 ||
          (fVar64 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar64)))) {
        pIVar39->NavMoveDir = 0;
        IVar27 = 0;
      }
      if (((uVar44 & 2) == 0) &&
         ((fVar64 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar64 ||
          (fVar64 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar64)))) {
        pIVar39->NavMoveDir = 1;
        IVar27 = 1;
      }
      if (((uVar44 & 4) == 0) &&
         ((fVar64 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar64 ||
          (fVar64 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar64)))) {
        pIVar39->NavMoveDir = 2;
        IVar27 = 2;
      }
      if (((uVar44 & 8) == 0) &&
         ((fVar64 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar64 ||
          (fVar64 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar64)))) {
        pIVar39->NavMoveDir = 3;
        IVar27 = 3;
      }
    }
    pIVar39->NavMoveClipDir = IVar27;
  }
  else {
    if ((pIVar39->NavMoveDir == -1) || (pIVar39->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2112,"void ImGui::NavUpdate()");
    }
    if (pIVar39->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2113,"void ImGui::NavUpdate()");
    }
    pIVar39->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar12 = GImGui;
  fVar64 = 0.0;
  if ((((((uVar16 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar22 = GImGui->NavWindow, pIVar22 != (ImGuiWindow *)0x0)) &&
      (((pIVar22->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar40 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar42 = false;
    bVar41 = false;
    if (bVar40) {
      bVar41 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar40 = IsKeyDown((pIVar12->IO).KeyMap[6]);
    if (bVar40) {
      bVar42 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar40 = IsKeyPressed((pIVar12->IO).KeyMap[7],true);
    if (bVar40) {
      bVar40 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar40 = false;
    }
    bVar15 = IsKeyPressed((pIVar12->IO).KeyMap[8],true);
    if (bVar15) {
      bVar15 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar15 = false;
    }
    fVar64 = 0.0;
    if ((bVar41 != bVar42) || (bVar40 != bVar15)) {
      if (((pIVar22->DC).NavLayerActiveMask == 0) && ((pIVar22->DC).NavHasScroll == true)) {
        bVar41 = IsKeyPressed((pIVar12->IO).KeyMap[5],true);
        if (bVar41) {
          (pIVar22->ScrollTarget).y =
               (pIVar22->Scroll).y - ((pIVar22->InnerRect).Max.y - (pIVar22->InnerRect).Min.y);
LAB_001d9fad:
          (pIVar22->ScrollTargetCenterRatio).y = 0.0;
        }
        else {
          bVar41 = IsKeyPressed((pIVar12->IO).KeyMap[6],true);
          if (bVar41) {
            fVar64 = ((pIVar22->InnerRect).Max.y - (pIVar22->InnerRect).Min.y) + (pIVar22->Scroll).y
            ;
LAB_001d9fa6:
            (pIVar22->ScrollTarget).y = fVar64;
            goto LAB_001d9fad;
          }
          if (bVar40 == false) {
            if (bVar15 != false) {
              fVar64 = (pIVar22->ScrollMax).y;
              goto LAB_001d9fa6;
            }
          }
          else {
            (pIVar22->ScrollTarget).y = 0.0;
            (pIVar22->ScrollTargetCenterRatio).y = 0.0;
          }
        }
LAB_001d9fb6:
        fVar64 = 0.0;
      }
      else {
        IVar32 = pIVar12->NavLayer;
        pIVar36 = pIVar22->NavRectRel + IVar32;
        fVar64 = GImGui->FontBaseSize * pIVar22->FontWindowScale;
        if (pIVar22->ParentWindow != (ImGuiWindow *)0x0) {
          fVar64 = fVar64 * pIVar22->ParentWindow->FontWindowScale;
        }
        fVar64 = (pIVar22->NavRectRel[IVar32].Max.y - pIVar22->NavRectRel[IVar32].Min.y) +
                 (((pIVar22->InnerRect).Max.y - (pIVar22->InnerRect).Min.y) - fVar64);
        fVar64 = (float)(~-(uint)(fVar64 <= 0.0) & (uint)fVar64);
        bVar41 = IsKeyPressed((pIVar12->IO).KeyMap[5],true);
        if (bVar41) {
          fVar64 = -fVar64;
          pIVar12->NavMoveDir = 3;
          pIVar12->NavMoveClipDir = 2;
          pIVar12->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar41 = IsKeyPressed((pIVar12->IO).KeyMap[6],true);
          if (bVar41) {
            pIVar12->NavMoveDir = 2;
            pIVar12->NavMoveClipDir = 3;
            pIVar12->NavMoveRequestFlags = 0x30;
          }
          else {
            if (bVar40 != false) {
              fVar64 = -(pIVar22->Scroll).y;
              pIVar22->NavRectRel[IVar32].Max.y = fVar64;
              pIVar22->NavRectRel[IVar32].Min.y = fVar64;
              fVar64 = (pIVar36->Min).x;
              pIVar6 = &pIVar22->NavRectRel[IVar32].Max;
              if (pIVar6->x <= fVar64 && fVar64 != pIVar6->x) {
                pIVar22->NavRectRel[IVar32].Max.x = 0.0;
                (pIVar36->Min).x = 0.0;
              }
              pIVar12->NavMoveDir = 3;
              pIVar12->NavMoveRequestFlags = 0x50;
              goto LAB_001d9fb6;
            }
            fVar64 = 0.0;
            if (bVar15 != false) {
              fVar55 = ((pIVar22->ScrollMax).y + (pIVar22->SizeFull).y) - (pIVar22->Scroll).y;
              pIVar22->NavRectRel[IVar32].Max.y = fVar55;
              pIVar22->NavRectRel[IVar32].Min.y = fVar55;
              fVar55 = (pIVar36->Min).x;
              pIVar6 = &pIVar22->NavRectRel[IVar32].Max;
              if (pIVar6->x <= fVar55 && fVar55 != pIVar6->x) {
                pIVar22->NavRectRel[IVar32].Max.x = 0.0;
                (pIVar36->Min).x = 0.0;
              }
              pIVar12->NavMoveDir = 2;
              pIVar12->NavMoveRequestFlags = 0x50;
            }
          }
        }
      }
    }
  }
  uVar16 = pIVar39->NavMoveDir;
  if (uVar16 == 0xffffffff) {
    bVar43 = pIVar39->NavMoveRequest;
    if ((bVar43 & 1) != 0) goto LAB_001d8a49;
    bVar40 = false;
  }
  else {
    pIVar39->NavMoveRequest = true;
    pIVar39->NavMoveDirLast = uVar16;
    bVar43 = 1;
LAB_001d8a49:
    bVar40 = true;
    if (pIVar39->NavId == 0) {
      pIVar39->NavInitRequest = true;
      pIVar39->NavInitRequestFromMove = true;
      pIVar39->NavInitResultId = 0;
      pIVar39->NavDisableHighlight = false;
    }
  }
  pIVar12 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar37 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar37;
    if (*pbVar37 != false) goto LAB_001d8b52;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_001d8b52:
    if (pIVar12->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2002,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar22 = pIVar39->NavWindow;
  if (((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x40000) == 0)) &&
     (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar55 = pIVar12->FontBaseSize * pIVar22->FontWindowScale;
    if (pIVar22->ParentWindow != (ImGuiWindow *)0x0) {
      fVar55 = fVar55 * pIVar22->ParentWindow->FontWindowScale;
    }
    fVar55 = (float)(int)(fVar55 * 100.0 * (pIVar39->IO).DeltaTime + 0.5);
    if (((pIVar22->DC).NavLayerActiveMask == 0) && ((bVar43 & (pIVar22->DC).NavHasScroll) == 1)) {
      if (uVar16 < 2) {
        lVar21 = 0x6c;
        lVar26 = 100;
        uVar44 = 0;
        lVar31 = 0x54;
      }
      else {
        if ((uVar16 & 0xfffffffe) != 2) goto LAB_001d8c4c;
        lVar21 = 0x70;
        lVar26 = 0x68;
        uVar44 = 2;
        lVar31 = 0x58;
      }
      *(float *)((long)&pIVar22->Name + lVar26) =
           (float)(int)(*(float *)(&DAT_002b21d8 + (ulong)(uVar16 == uVar44) * 4) * fVar55 +
                       *(float *)((long)&pIVar22->Name + lVar31));
      *(undefined4 *)((long)&pIVar22->Name + lVar21) = 0;
    }
LAB_001d8c4c:
    IVar46 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar45 = IVar46.x;
    fVar54 = IVar46.y;
    if (((fVar45 != 0.0) || (NAN(fVar45))) && (pIVar22->ScrollbarX == true)) {
      (pIVar22->ScrollTarget).x = (float)(int)(fVar45 * fVar55 + (pIVar22->Scroll).x);
      (pIVar22->ScrollTargetCenterRatio).x = 0.0;
      pIVar39->NavMoveFromClampedRefRect = true;
    }
    if ((fVar54 != 0.0) || (NAN(fVar54))) {
      (pIVar22->ScrollTarget).y = (float)(int)(fVar54 * fVar55 + (pIVar22->Scroll).y);
      (pIVar22->ScrollTargetCenterRatio).y = 0.0;
      pIVar39->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar39->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar39->NavMoveResultLocal).ID = 0;
  (pIVar39->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar39->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar39->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar39->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar39->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar39->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar39->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar39->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar39->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar39->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar39->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar39->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar39->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar39->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar39->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar39->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar39->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar39->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar39->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar39->NavMoveResultOther).ID = 0;
  (pIVar39->NavMoveResultOther).FocusScopeId = 0;
  (pIVar39->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar39->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar39->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar39->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar39->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar39->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar39->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((bVar40) && (pIVar39->NavMoveFromClampedRefRect == true)) &&
     (pIVar39->NavLayer == ImGuiNavLayer_Main)) {
    IVar46 = (pIVar22->InnerRect).Min;
    fVar55 = (pIVar22->Pos).x;
    fVar54 = (pIVar22->Pos).y;
    fVar56 = (IVar46.x - fVar55) + -1.0;
    fVar61 = (IVar46.y - fVar54) + -1.0;
    IVar46 = (pIVar22->InnerRect).Max;
    fVar45 = (IVar46.x - fVar55) + 1.0;
    fVar54 = (IVar46.y - fVar54) + 1.0;
    fVar55 = pIVar22->NavRectRel[0].Min.x;
    if (((fVar55 < fVar56) || (pIVar22->NavRectRel[0].Min.y < fVar61)) ||
       ((fVar45 < pIVar22->NavRectRel[0].Max.x || (fVar54 < pIVar22->NavRectRel[0].Max.y)))) {
      fVar65 = pIVar12->FontBaseSize * pIVar22->FontWindowScale;
      if (pIVar22->ParentWindow != (ImGuiWindow *)0x0) {
        fVar65 = fVar65 * pIVar22->ParentWindow->FontWindowScale;
      }
      auVar66._0_4_ = fVar65 * 0.5;
      auVar67._0_4_ = fVar45 - fVar56;
      auVar67._4_4_ = fVar54 - fVar61;
      auVar67._8_8_ = 0;
      auVar66._4_4_ = auVar66._0_4_;
      auVar66._8_4_ = auVar66._0_4_;
      auVar66._12_4_ = auVar66._0_4_;
      auVar68 = minps(auVar67,auVar66);
      fVar56 = fVar56 + auVar68._0_4_;
      fVar61 = fVar61 + auVar68._4_4_;
      fVar65 = pIVar22->NavRectRel[0].Min.y;
      uVar16 = -(uint)(fVar56 <= fVar55);
      uVar44 = -(uint)(fVar61 <= fVar65);
      auVar59._0_4_ = fVar45 - auVar68._0_4_;
      auVar59._4_4_ = fVar54 - auVar68._4_4_;
      auVar59._8_4_ = 0.0 - auVar68._8_4_;
      auVar59._12_4_ = 0.0 - auVar68._12_4_;
      auVar68._8_8_ = 0;
      auVar68._0_4_ = pIVar22->NavRectRel[0].Max.x;
      auVar68._4_4_ = pIVar22->NavRectRel[0].Max.y;
      auVar59 = minps(auVar68,auVar59);
      pIVar22->NavRectRel[0].Min =
           (ImVec2)(CONCAT44(~uVar44 & (uint)fVar61,~uVar16 & (uint)fVar56) |
                   CONCAT44((uint)fVar65 & uVar44,(uint)fVar55 & uVar16));
      pIVar22->NavRectRel[0].Max = auVar59._0_8_;
      pIVar39->NavId = 0;
      pIVar39->NavFocusScopeId = 0;
      pIVar22 = pIVar39->NavWindow;
    }
    pIVar39->NavMoveFromClampedRefRect = false;
  }
  if (pIVar22 == (ImGuiWindow *)0x0) {
    IVar48 = (pIVar12->IO).DisplaySize;
    fVar55 = 0.0;
    fVar45 = 0.0;
  }
  else {
    IVar46 = pIVar22->NavRectRel[pIVar39->NavLayer].Min;
    IVar48 = pIVar22->NavRectRel[pIVar39->NavLayer].Max;
    IVar47.x = 0.0;
    IVar47.y = 0.0;
    IVar57.x = 0.0;
    IVar57.y = 0.0;
    if (IVar46.y <= IVar48.y && IVar46.x <= IVar48.x) {
      IVar47 = IVar48;
      IVar57 = IVar46;
    }
    fVar54 = (pIVar22->Pos).x;
    fVar55 = IVar57.x + fVar54;
    fVar56 = (pIVar22->Pos).y;
    fVar45 = IVar57.y + fVar56;
    IVar48.x = IVar47.x + fVar54;
    IVar48.y = IVar47.y + fVar56;
  }
  (pIVar39->NavScoringRectScreen).Min.y = fVar45 + fVar64;
  fVar56 = IVar48.y + fVar64;
  (pIVar39->NavScoringRectScreen).Max.y = fVar56;
  fVar54 = fVar55 + 1.0;
  if (IVar48.x <= fVar55 + 1.0) {
    fVar54 = IVar48.x;
  }
  (pIVar39->NavScoringRectScreen).Min.x = fVar54;
  (pIVar39->NavScoringRectScreen).Max.x = fVar54;
  if (fVar56 < fVar45 + fVar64) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x2164,"void ImGui::NavUpdate()");
  }
  pIVar39->NavScoringCount = 0;
  pIVar6 = &(pIVar12->IO).MousePos;
  bVar40 = IsMousePosValid(pIVar6);
  if (bVar40) {
    IVar46 = (pIVar12->IO).MousePos;
    IVar49.x = (float)(int)IVar46.x;
    IVar49.y = (float)(int)IVar46.y;
    pIVar12->LastValidMousePos = IVar49;
    (pIVar12->IO).MousePos = IVar49;
  }
  bVar40 = IsMousePosValid(pIVar6);
  if ((bVar40) && (bVar40 = IsMousePosValid(&(pIVar12->IO).MousePosPrev), bVar40)) {
    IVar46 = (pIVar12->IO).MousePos;
    IVar48 = (pIVar12->IO).MousePosPrev;
    IVar50.x = IVar46.x - IVar48.x;
    IVar50.y = IVar46.y - IVar48.y;
    (pIVar12->IO).MouseDelta = IVar50;
    if ((((IVar50.x != 0.0) || (NAN(IVar50.x))) || (IVar50.y != 0.0)) || (NAN(IVar50.y))) {
      pIVar12->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar12->IO).MouseDelta.x = 0.0;
    (pIVar12->IO).MouseDelta.y = 0.0;
  }
  (pIVar12->IO).MousePosPrev = (pIVar12->IO).MousePos;
  lVar21 = 0;
  do {
    if ((pIVar12->IO).MouseDown[lVar21] == true) {
      fVar64 = (pIVar12->IO).MouseDownDuration[lVar21];
      pbVar37 = (pIVar12->IO).MouseClicked + lVar21;
      *pbVar37 = fVar64 < 0.0;
      pbVar37[10] = false;
      (pIVar12->IO).MouseDownDurationPrev[lVar21] = fVar64;
      if (0.0 <= fVar64) {
        (pIVar12->IO).MouseDownDuration[lVar21] = fVar64 + (pIVar12->IO).DeltaTime;
        (pIVar12->IO).MouseDoubleClicked[lVar21] = false;
        bVar40 = IsMousePosValid(pIVar6);
        auVar53 = ZEXT816(0);
        if (bVar40) {
          IVar46 = (pIVar12->IO).MousePos;
          IVar48 = (pIVar12->IO).MouseClickedPos[lVar21];
          auVar53._0_4_ = IVar46.x - IVar48.x;
          auVar53._4_4_ = IVar46.y - IVar48.y;
          auVar53._8_8_ = 0;
        }
        fVar64 = (pIVar12->IO).MouseDragMaxDistanceSqr[lVar21];
        fVar55 = auVar53._0_4_ * auVar53._0_4_ + auVar53._4_4_ * auVar53._4_4_;
        uVar16 = -(uint)(fVar55 <= fVar64);
        (pIVar12->IO).MouseDragMaxDistanceSqr[lVar21] =
             (float)(~uVar16 & (uint)fVar55 | (uint)fVar64 & uVar16);
        IVar46 = (pIVar12->IO).MouseDragMaxDistanceAbs[lVar21];
        auVar62._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
        auVar62._8_4_ = auVar53._8_4_ ^ 0x80000000;
        auVar62._12_4_ = auVar53._12_4_ ^ 0x80000000;
        auVar59 = maxps(auVar62,auVar53);
        fVar64 = IVar46.x;
        fVar55 = IVar46.y;
        uVar16 = -(uint)(auVar59._0_4_ <= fVar64);
        uVar44 = -(uint)(auVar59._4_4_ <= fVar55);
        pIVar7 = (pIVar12->IO).MouseDragMaxDistanceAbs + lVar21;
        pIVar7->x = (float)(~uVar16 & (uint)auVar59._0_4_ | (uint)fVar64 & uVar16);
        pIVar7->y = (float)(~uVar44 & (uint)auVar59._4_4_ | (uint)fVar55 & uVar44);
      }
      else {
        (pIVar12->IO).MouseDownDuration[lVar21] = 0.0;
        (pIVar12->IO).MouseDoubleClicked[lVar21] = false;
        dVar51 = pIVar12->Time;
        if ((float)(dVar51 - (pIVar12->IO).MouseClickedTime[lVar21]) <
            (pIVar12->IO).MouseDoubleClickTime) {
          bVar40 = IsMousePosValid(pIVar6);
          fVar64 = 0.0;
          fVar55 = 0.0;
          if (bVar40) {
            IVar46 = (pIVar12->IO).MousePos;
            IVar48 = (pIVar12->IO).MouseClickedPos[lVar21];
            fVar64 = IVar46.x - IVar48.x;
            fVar55 = IVar46.y - IVar48.y;
          }
          fVar45 = (pIVar12->IO).MouseDoubleClickMaxDist;
          dVar51 = -3.4028234663852886e+38;
          if (fVar64 * fVar64 + fVar55 * fVar55 < fVar45 * fVar45) {
            (pIVar12->IO).MouseDoubleClicked[lVar21] = true;
            dVar51 = -3.4028234663852886e+38;
          }
        }
        (pIVar12->IO).MouseClickedTime[lVar21] = dVar51;
        (pIVar12->IO).MouseClickedPos[lVar21] = (pIVar12->IO).MousePos;
        (pIVar12->IO).MouseDownWasDoubleClick[lVar21] = (pIVar12->IO).MouseDoubleClicked[lVar21];
        pIVar7 = (pIVar12->IO).MouseDragMaxDistanceAbs + lVar21;
        pIVar7->x = 0.0;
        pIVar7->y = 0.0;
        (pIVar12->IO).MouseDragMaxDistanceSqr[lVar21] = 0.0;
      }
    }
    else {
      (pIVar12->IO).MouseClicked[lVar21] = false;
      fVar64 = (pIVar12->IO).MouseDownDuration[lVar21];
      (pIVar12->IO).MouseReleased[lVar21] = 0.0 <= fVar64;
      pbVar37 = (pIVar12->IO).MouseClicked + lVar21;
      (pIVar12->IO).MouseDownDurationPrev[lVar21] = fVar64;
      (pIVar12->IO).MouseDownDuration[lVar21] = -1.0;
      (pIVar12->IO).MouseDoubleClicked[lVar21] = false;
    }
    if (((pIVar12->IO).MouseDown[lVar21] == false) && ((pIVar12->IO).MouseReleased[lVar21] == false)
       ) {
      (pIVar12->IO).MouseDownWasDoubleClick[lVar21] = false;
    }
    if (*pbVar37 == true) {
      pIVar12->NavDisableMouseHover = false;
    }
    lVar21 = lVar21 + 1;
  } while (lVar21 != 5);
  fVar64 = (pIVar11->IO).DeltaTime;
  iVar20 = pIVar11->FramerateSecPerFrameIdx;
  pIVar11->FramerateSecPerFrameAccum =
       (fVar64 - pIVar11->FramerateSecPerFrame[iVar20]) + pIVar11->FramerateSecPerFrameAccum;
  pIVar11->FramerateSecPerFrame[iVar20] = fVar64;
  iVar19 = iVar20 + (int)((ulong)((long)(iVar20 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar11->FramerateSecPerFrameIdx = iVar20 + 1 + ((iVar19 >> 6) - (iVar19 >> 0x1f)) * -0x78;
  uVar16 = -(uint)(0.0 < pIVar11->FramerateSecPerFrameAccum);
  (pIVar11->IO).Framerate =
       (float)(~uVar16 & 0x7f7fffff |
              (uint)(1.0 / (pIVar11->FramerateSecPerFrameAccum / 120.0)) & uVar16);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar22 = GetTopMostPopupModal();
  if ((pIVar22 != (ImGuiWindow *)0x0) ||
     ((pIVar11->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar11->NavWindowingHighlightAlpha)))) {
    fVar64 = (pIVar11->IO).DeltaTime * 6.0 + pIVar11->DimBgRatio;
    if (1.0 <= fVar64) {
      fVar64 = 1.0;
    }
    pIVar11->DimBgRatio = fVar64;
  }
  else {
    fVar64 = (pIVar11->IO).DeltaTime * -10.0 + pIVar11->DimBgRatio;
    pIVar11->DimBgRatio = (float)(-(uint)(0.0 <= fVar64) & (uint)fVar64);
  }
  pIVar11->MouseCursor = 0;
  pIVar11->WantTextInputNextFrame = -1;
  pIVar11->WantCaptureMouseNextFrame = -1;
  pIVar11->WantCaptureKeyboardNextFrame = -1;
  (pIVar11->PlatformImePos).x = 1.0;
  pIVar39 = GImGui;
  (pIVar11->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar40 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar40) &&
        (fVar64 = (pIVar39->IO).MouseDragThreshold,
        fVar55 = (pIVar39->IO).MousePos.x - (pIVar39->WheelingWindowRefMousePos).x,
        fVar45 = (pIVar39->IO).MousePos.y - (pIVar39->WheelingWindowRefMousePos).y,
        fVar64 * fVar64 < fVar55 * fVar55 + fVar45 * fVar45)) ||
       (pIVar39->WheelingWindowTimer <= 0.0)) {
      pIVar39->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar39->WheelingWindowTimer = 0.0;
    }
  }
  pIVar12 = GImGui;
  fVar64 = (pIVar39->IO).MouseWheel;
  if (((((fVar64 != 0.0) || (fVar55 = (pIVar39->IO).MouseWheelH, fVar55 != 0.0)) || (NAN(fVar55)))
      && ((pIVar22 = pIVar39->WheelingWindow, pIVar22 != (ImGuiWindow *)0x0 ||
          (pIVar22 = pIVar39->HoveredWindow, pIVar22 != (ImGuiWindow *)0x0)))) &&
     (pIVar22->Collapsed == false)) {
    if ((fVar64 != 0.0) || (NAN(fVar64))) {
      if ((pIVar39->IO).KeyCtrl == true) {
        if ((pIVar39->IO).FontAllowUserScaling == true) {
          if (GImGui->WheelingWindow != pIVar22) {
            GImGui->WheelingWindow = pIVar22;
            pIVar12->WheelingWindowRefMousePos = (pIVar12->IO).MousePos;
            pIVar12->WheelingWindowTimer = 2.0;
            fVar64 = (pIVar39->IO).MouseWheel;
          }
          fVar55 = pIVar22->FontWindowScale;
          fVar45 = fVar64 * 0.1 + fVar55;
          fVar64 = 2.5;
          if (fVar45 <= 2.5) {
            fVar64 = fVar45;
          }
          fVar64 = (float)(-(uint)(fVar45 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar45 < 0.5) & (uint)fVar64);
          pIVar22->FontWindowScale = fVar64;
          if ((pIVar22->Flags & 0x1000000) == 0) {
            fVar64 = fVar64 / fVar55;
            IVar46 = pIVar22->Size;
            auVar60._8_8_ = 0;
            auVar60._0_4_ = IVar46.x;
            auVar60._4_4_ = IVar46.y;
            IVar48 = (pIVar39->IO).MousePos;
            fVar55 = (pIVar22->Pos).x;
            fVar45 = (pIVar22->Pos).y;
            auVar63._0_4_ = (IVar48.x - fVar55) * (1.0 - fVar64) * IVar46.x;
            auVar63._4_4_ = (IVar48.y - fVar45) * (1.0 - fVar64) * IVar46.y;
            auVar63._8_8_ = 0;
            auVar59 = divps(auVar63,auVar60);
            local_40.Min.x = auVar59._0_4_ + fVar55;
            local_40.Min.y = auVar59._4_4_ + fVar45;
            SetWindowPos(pIVar22,&local_40.Min,0);
            IVar52.x = (float)(int)((pIVar22->Size).x * fVar64);
            IVar52.y = (float)(int)((pIVar22->Size).y * fVar64);
            IVar58.x = (float)(int)((pIVar22->SizeFull).x * fVar64);
            IVar58.y = (float)(int)((pIVar22->SizeFull).y * fVar64);
            pIVar22->Size = IVar52;
            pIVar22->SizeFull = IVar58;
          }
          goto LAB_001d9482;
        }
      }
      else if ((pIVar39->IO).KeyShift == false) {
        if (GImGui->WheelingWindow != pIVar22) {
          GImGui->WheelingWindow = pIVar22;
          pIVar12->WheelingWindowRefMousePos = (pIVar12->IO).MousePos;
          pIVar12->WheelingWindowTimer = 2.0;
        }
        uVar16 = pIVar22->Flags;
        while (((uVar16 >> 0x18 & 1) != 0 &&
               (((uVar16 & 0x210) == 0x10 ||
                ((fVar55 = (pIVar22->ScrollMax).y, fVar55 == 0.0 && (!NAN(fVar55)))))))) {
          pIVar22 = pIVar22->ParentWindow;
          uVar16 = pIVar22->Flags;
        }
        if ((uVar16 & 0x210) == 0) {
          fVar55 = ((pIVar22->InnerRect).Max.y - (pIVar22->InnerRect).Min.y) * 0.67;
          fVar45 = pIVar12->FontBaseSize * pIVar22->FontWindowScale;
          if (pIVar22->ParentWindow != (ImGuiWindow *)0x0) {
            fVar45 = fVar45 * pIVar22->ParentWindow->FontWindowScale;
          }
          fVar54 = fVar45 * 5.0;
          if (fVar55 <= fVar45 * 5.0) {
            fVar54 = fVar55;
          }
          (pIVar22->ScrollTarget).y = (pIVar22->Scroll).y - fVar64 * (float)(int)fVar54;
          (pIVar22->ScrollTargetCenterRatio).y = 0.0;
        }
      }
    }
    pIVar12 = GImGui;
    fVar64 = (pIVar39->IO).MouseWheelH;
    if (((fVar64 == 0.0) && (!NAN(fVar64))) || ((pIVar39->IO).KeyShift == true)) {
      fVar64 = (pIVar39->IO).MouseWheel;
      if (((fVar64 == 0.0) && (!NAN(fVar64))) || ((pIVar39->IO).KeyShift != true))
      goto LAB_001d9482;
    }
    if ((pIVar39->IO).KeyCtrl == false) {
      if (GImGui->WheelingWindow != pIVar22) {
        GImGui->WheelingWindow = pIVar22;
        pIVar12->WheelingWindowRefMousePos = (pIVar12->IO).MousePos;
        pIVar12->WheelingWindowTimer = 2.0;
      }
      uVar16 = pIVar22->Flags;
      while (((uVar16 >> 0x18 & 1) != 0 &&
             (((uVar16 & 0x210) == 0x10 ||
              ((fVar55 = (pIVar22->ScrollMax).x, fVar55 == 0.0 && (!NAN(fVar55)))))))) {
        pIVar22 = pIVar22->ParentWindow;
        uVar16 = pIVar22->Flags;
      }
      if ((uVar16 & 0x210) == 0) {
        fVar55 = ((pIVar22->InnerRect).Max.x - (pIVar22->InnerRect).Min.x) * 0.67;
        fVar45 = pIVar12->FontBaseSize * pIVar22->FontWindowScale;
        if (pIVar22->ParentWindow != (ImGuiWindow *)0x0) {
          fVar45 = fVar45 * pIVar22->ParentWindow->FontWindowScale;
        }
        fVar54 = fVar45 + fVar45;
        if (fVar55 <= fVar45 + fVar45) {
          fVar54 = fVar55;
        }
        (pIVar22->ScrollTarget).x = (pIVar22->Scroll).x - fVar64 * (float)(int)fVar54;
        (pIVar22->ScrollTargetCenterRatio).x = 0.0;
      }
    }
  }
LAB_001d9482:
  pIVar22 = pIVar11->NavWindow;
  if ((((pIVar22 == (ImGuiWindow *)0x0) || (pIVar22->Active != true)) ||
      ((pIVar22->Flags & 0x40000) != 0)) ||
     (((pIVar11->IO).KeyCtrl != false || (iVar20 = (GImGui->IO).KeyMap[0], iVar20 < 0)))) {
    pIVar11->FocusTabPressed = false;
  }
  else {
    bVar40 = IsKeyPressed(iVar20,true);
    pIVar11->FocusTabPressed = bVar40;
    if ((bVar40) && (pIVar11->ActiveId == 0)) {
      pIVar22 = pIVar11->NavWindow;
      pIVar11->FocusRequestNextWindow = pIVar22;
      pIVar11->FocusRequestNextCounterRegular = 0x7fffffff;
      if ((pIVar11->NavId == 0) || (pIVar11->NavIdTabCounter == 0x7fffffff)) {
        iVar20 = -(uint)(pIVar11->IO).KeyShift;
      }
      else {
        iVar20 = pIVar11->NavIdTabCounter + (-(uint)(pIVar11->IO).KeyShift | 1) + 1;
      }
      pIVar11->FocusRequestNextCounterTabStop = iVar20;
      goto LAB_001d953c;
    }
  }
  pIVar22 = pIVar11->FocusRequestNextWindow;
LAB_001d953c:
  pIVar11->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar11->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar11->FocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar22 != (ImGuiWindow *)0x0) {
    pIVar11->FocusRequestCurrWindow = pIVar22;
    if ((pIVar11->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar20 = (pIVar22->DC).FocusCounterRegular, iVar20 != -1)) {
      pIVar11->FocusRequestCurrCounterRegular =
           (pIVar11->FocusRequestNextCounterRegular + iVar20 + 1) % (iVar20 + 1);
    }
    if ((pIVar11->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar20 = (pIVar22->DC).FocusCounterTabStop, iVar20 != -1)) {
      pIVar11->FocusRequestCurrCounterTabStop =
           (pIVar11->FocusRequestNextCounterTabStop + iVar20 + 1) % (iVar20 + 1);
    }
    pIVar11->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar11->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar11->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar11->NavIdTabCounter = 0x7fffffff;
  uVar16 = (pIVar11->WindowsFocusOrder).Size;
  if (uVar16 != (pIVar11->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xeab,"void ImGui::NewFrame()");
  }
  fVar64 = (pIVar11->IO).ConfigWindowsMemoryCompactTimer;
  if (0.0 <= fVar64) {
    fVar64 = (float)pIVar11->Time - fVar64;
  }
  else {
    fVar64 = 3.4028235e+38;
  }
  if (uVar16 != 0) {
    uVar38 = 0;
    do {
      if ((long)(int)uVar16 <= (long)uVar38) {
        pcVar24 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_001da015;
      }
      pIVar22 = (pIVar11->Windows).Data[uVar38];
      bVar40 = pIVar22->Active;
      pIVar22->WasActive = bVar40;
      pIVar22->BeginCount = 0;
      pIVar22->Active = false;
      pIVar22->WriteAccessed = false;
      if (((bVar40 == false) && (pIVar22->MemoryCompacted == false)) &&
         (pIVar22->LastTimeActive <= fVar64 && fVar64 != pIVar22->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar22);
        uVar16 = (pIVar11->Windows).Size;
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 != uVar16);
  }
  if ((pIVar11->NavWindow != (ImGuiWindow *)0x0) && (pIVar11->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar11->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + 1;
    }
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar9 = (pIVar11->CurrentWindowStack).Data;
    if (ppIVar9 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar9,(long)(pIVar11->CurrentWindowStack).Size << 3);
      ppIVar9 = (pIVar11->CurrentWindowStack).Data;
      if ((ppIVar9 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
    }
    (pIVar11->CurrentWindowStack).Data = __dest;
    (pIVar11->CurrentWindowStack).Capacity = 0;
  }
  (pIVar11->CurrentWindowStack).Size = 0;
  if ((pIVar11->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + 1;
    }
    __dest_00 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar10 = (pIVar11->BeginPopupStack).Data;
    if (pIVar10 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_00,pIVar10,(long)(pIVar11->BeginPopupStack).Size * 0x30);
      pIVar10 = (pIVar11->BeginPopupStack).Data;
      if ((pIVar10 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
    }
    (pIVar11->BeginPopupStack).Data = __dest_00;
    (pIVar11->BeginPopupStack).Capacity = 0;
  }
  (pIVar11->BeginPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar11->NavWindow,false);
  pIVar39 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar39->DebugItemPickerActive == true) {
    uVar16 = pIVar39->HoveredIdPreviousFrame;
    pIVar39->MouseCursor = 7;
    iVar20 = (pIVar39->IO).KeyMap[0xe];
    if ((-1 < iVar20) && (bVar40 = IsKeyPressed(iVar20,true), bVar40)) {
      pIVar39->DebugItemPickerActive = false;
    }
    pIVar12 = GImGui;
    fVar64 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar64 != 0.0) || (NAN(fVar64))) {
      uVar44 = (uint)(uVar16 == 0);
    }
    else if (uVar16 == 0) {
      uVar44 = 1;
    }
    else {
      pIVar39->DebugItemPickerBreakId = uVar16;
      pIVar39->DebugItemPickerActive = false;
      uVar44 = 0;
    }
    pIVar5 = &pIVar12->NextWindowData;
    *(byte *)&pIVar5->Flags = (byte)pIVar5->Flags | 0x40;
    (pIVar12->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar16);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar44 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar39 = GImGui;
  }
  *(byte *)&(pIVar39->NextWindowData).Flags = (byte)(pIVar39->NextWindowData).Flags | 2;
  (pIVar39->NextWindowData).SizeVal.x = 400.0;
  (pIVar39->NextWindowData).SizeVal.y = 400.0;
  (pIVar39->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  pIVar11->WithinFrameScopeWithImplicitWindow = true;
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    NewFrameSanityChecks();

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = g.ActiveIdUsingNavInputMask = 0;
        g.ActiveIdUsingKeyInputMask = 0;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterRegular = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTabStop = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTabStop = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterRegular = g.FocusRequestCurrCounterTabStop = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterRegular != INT_MAX && window->DC.FocusCounterRegular != -1)
            g.FocusRequestCurrCounterRegular = ImModPositive(g.FocusRequestNextCounterRegular, window->DC.FocusCounterRegular + 1);
        if (g.FocusRequestNextCounterTabStop != INT_MAX && window->DC.FocusCounterTabStop != -1)
            g.FocusRequestCurrCounterTabStop = ImModPositive(g.FocusRequestNextCounterTabStop, window->DC.FocusCounterTabStop + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterRegular = g.FocusRequestNextCounterTabStop = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect (this is totally functional but we may need decide if the side-effects are desirable)
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    g.WithinFrameScopeWithImplicitWindow = true;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}